

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QList<QStringView> * __thiscall
QStringView::split(QList<QStringView> *__return_storage_ptr__,QStringView *this,
                  QRegularExpression *re,SplitBehavior behavior)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  QStringView subjectView;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator iterator;
  QRegularExpressionMatch local_60;
  QRegularExpression local_58;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QStringView *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar1 = QRegularExpression::isValid(re);
  if (bVar1) {
    local_58.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    subjectView.m_data = (storage_type_conflict *)this->m_size;
    subjectView.m_size = (qsizetype)re;
    QRegularExpression::globalMatchView
              (&local_58,subjectView,(qsizetype)this->m_data,NormalMatch,(MatchOptions)0x0);
    qVar3 = 0;
    while( true ) {
      bVar1 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_58)
      ;
      if (!bVar1) break;
      local_60.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_60);
      qVar2 = QRegularExpressionMatch::capturedStart(&local_60,0);
      if ((Data *)(qVar2 - qVar3) != (Data *)0x0 ||
          (QFlagsStorage<Qt::SplitBehaviorFlags>)
          behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i ==
          (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0) {
        local_50.ptr = this->m_data + qVar3;
        local_50.d = (Data *)(qVar2 - qVar3);
        QList<QStringView>::emplaceBack<QStringView>
                  (__return_storage_ptr__,(QStringView *)&local_50);
      }
      qVar3 = QRegularExpressionMatch::capturedEnd(&local_60,0);
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_60);
    }
    pDVar4 = (Data *)(this->m_size - qVar3);
    if (pDVar4 != (Data *)0x0 ||
        (QFlagsStorage<Qt::SplitBehaviorFlags>)
        behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i == (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0)
    {
      local_50.ptr = this->m_data + qVar3;
      local_50.d = pDVar4;
      QList<QStringView>::emplaceBack<QStringView>(__return_storage_ptr__,(QStringView *)&local_50);
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_58);
  }
  else {
    QRegularExpression::pattern((QString *)&local_50,re);
    qtWarnAboutInvalidRegularExpression((QString *)&local_50,"QString::split");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QStringView> QStringView::split(const QRegularExpression &re, Qt::SplitBehavior behavior) const
{
    return splitString<QList<QStringView>>(*this, re, &QRegularExpression::globalMatchView, behavior);
}